

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynClassStaticIf * ParseClassStaticIf(ParseContext *ctx,bool nested)

{
  Lexeme *begin;
  IntrusiveList<SynFunctionDefinition> functions;
  IntrusiveList<SynAccessor> accessors;
  IntrusiveList<SynVariableDefinitions> members;
  IntrusiveList<SynConstantSet> constantSets;
  IntrusiveList<SynClassStaticIf> staticIfs_00;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *end;
  SynClassElements *trueBlock_00;
  SynClassStaticIf *pSVar3;
  IntrusiveList<SynConstantSet> local_c0;
  IntrusiveList<SynVariableDefinitions> local_b0;
  IntrusiveList<SynAccessor> local_a0;
  IntrusiveList<SynFunctionDefinition> local_90;
  IntrusiveList<SynTypedef> local_80;
  undefined1 local_70 [8];
  IntrusiveList<SynClassStaticIf> staticIfs;
  Lexeme *pos;
  SynClassElements *falseBlock;
  SynClassElements *trueBlock;
  SynBase *pSStack_40;
  bool hasBlock;
  SynBase *condition;
  Lexeme *start;
  bool nested_local;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  if ((nested) || (bVar1 = ParseContext::Consume(ctx,lex_at), bVar1)) {
    bVar1 = ParseContext::Consume(ctx,lex_if);
    if (bVar1) {
      anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
      pSStack_40 = ParseAssignment(ctx);
      if (pSStack_40 == (SynBase *)0x0) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report
                  (ctx,pLVar2,"ERROR: condition not found in \'if\' statement");
        pSStack_40 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Current(ctx);
        end = ParseContext::Current(ctx);
        SynError::SynError((SynError *)pSStack_40,pLVar2,end);
      }
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
      bVar1 = ParseContext::Consume(ctx,lex_ofigure);
      trueBlock_00 = ParseClassElements(ctx);
      if (bVar1) {
        anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
      }
      pos = (Lexeme *)0x0;
      bVar1 = ParseContext::Consume(ctx,lex_else);
      if (bVar1) {
        bVar1 = ParseContext::At(ctx,lex_if);
        if (bVar1) {
          staticIfs.tail = (SynClassStaticIf *)ctx->currentLexeme;
          IntrusiveList<SynClassStaticIf>::IntrusiveList
                    ((IntrusiveList<SynClassStaticIf> *)local_70);
          pSVar3 = ParseClassStaticIf(ctx,true);
          IntrusiveList<SynClassStaticIf>::push_back
                    ((IntrusiveList<SynClassStaticIf> *)local_70,pSVar3);
          pos = (Lexeme *)ParseContext::get<SynClassElements>(ctx);
          pSVar3 = staticIfs.tail;
          pLVar2 = ParseContext::Previous(ctx);
          IntrusiveList<SynTypedef>::IntrusiveList(&local_80);
          IntrusiveList<SynFunctionDefinition>::IntrusiveList(&local_90);
          IntrusiveList<SynAccessor>::IntrusiveList(&local_a0);
          IntrusiveList<SynVariableDefinitions>::IntrusiveList(&local_b0);
          IntrusiveList<SynConstantSet>::IntrusiveList(&local_c0);
          functions.tail = local_90.tail;
          functions.head = local_90.head;
          accessors.tail = local_a0.tail;
          accessors.head = local_a0.head;
          members.tail = local_b0.tail;
          members.head = local_b0.head;
          constantSets.tail = local_c0.tail;
          constantSets.head = local_c0.head;
          staticIfs_00.tail = staticIfs.head;
          staticIfs_00.head = (SynClassStaticIf *)local_70;
          SynClassElements::SynClassElements
                    ((SynClassElements *)pos,(Lexeme *)pSVar3,pLVar2,local_80,functions,accessors,
                     members,constantSets,staticIfs_00);
        }
        else {
          bVar1 = ParseContext::Consume(ctx,lex_ofigure);
          pos = (Lexeme *)ParseClassElements(ctx);
          if (bVar1) {
            anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found")
            ;
          }
        }
      }
      ctx_local = (ParseContext *)ParseContext::get<SynClassStaticIf>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynClassStaticIf::SynClassStaticIf
                ((SynClassStaticIf *)ctx_local,begin,pLVar2,pSStack_40,trueBlock_00,
                 (SynClassElements *)pos);
    }
    else {
      ctx->currentLexeme = begin;
      ctx_local = (ParseContext *)0x0;
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynClassStaticIf *)ctx_local;
}

Assistant:

SynClassStaticIf* ParseClassStaticIf(ParseContext &ctx, bool nested)
{
	Lexeme *start = ctx.currentLexeme;

	if(nested || ctx.Consume(lex_at))
	{
		if(!ctx.Consume(lex_if))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		bool hasBlock = ctx.Consume(lex_ofigure);

		SynClassElements *trueBlock = ParseClassElements(ctx);

		if(hasBlock)
			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		SynClassElements *falseBlock = NULL;

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
			{
				Lexeme *pos = ctx.currentLexeme;

				IntrusiveList<SynClassStaticIf> staticIfs;

				staticIfs.push_back(ParseClassStaticIf(ctx, true));

				falseBlock = new (ctx.get<SynClassElements>()) SynClassElements(pos, ctx.Previous(), IntrusiveList<SynTypedef>(), IntrusiveList<SynFunctionDefinition>(), IntrusiveList<SynAccessor>(), IntrusiveList<SynVariableDefinitions>(), IntrusiveList<SynConstantSet>(), staticIfs);
			}
			else
			{
				hasBlock = ctx.Consume(lex_ofigure);

				falseBlock = ParseClassElements(ctx);

				if(hasBlock)
					CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
			}
		}

		return new (ctx.get<SynClassStaticIf>()) SynClassStaticIf(start, ctx.Previous(), condition, trueBlock, falseBlock);
	}

	return NULL;
}